

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::RecordEndScopeObject(ByteCodeWriter *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggerScope *currentScope;
  
  currentScope = this->m_currentDebuggerScope;
  if (currentScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xc38,"(this->m_currentDebuggerScope)",
                                "this->m_currentDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    currentScope = this->m_currentDebuggerScope;
  }
  FunctionBody::RecordEndScopeObject
            (this->m_functionWrite,currentScope,(this->m_byteCodeData).currentOffset - 1);
  PopDebuggerScope(this);
  return;
}

Assistant:

void ByteCodeWriter::RecordEndScopeObject()
    {
        Assert(this->m_currentDebuggerScope);

        m_functionWrite->RecordEndScopeObject(this->m_currentDebuggerScope, m_byteCodeData.GetCurrentOffset() - 1);
        PopDebuggerScope();
    }